

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhr_request_public.c
# Opt level: O3

nhr_bool nhr_request_send(nhr_request request)

{
  nhr_bool nVar1;
  
  if (request != (nhr_request)0x0) {
    if ((((request->scheme != (char *)0x0) && (request->host != (char *)0x0)) &&
        (request->path != (char *)0x0)) &&
       (((request->method != 0 && (request->on_recvd_response != (nhr_on_request_recvd_response)0x0)
         ) && (request->on_error != (nhr_on_request_error)0x0)))) {
      request->error_code = nhr_error_code_none;
      nVar1 = nhr_request_create_start_work_thread(request);
      return nVar1;
    }
    request->error_code = nhr_error_code_missed_parameter;
  }
  return '\0';
}

Assistant:

nhr_bool nhr_request_send(nhr_request request) {
	if (!request) {
		return nhr_false;
	}

	if (!request->scheme || !request->host || !request->path || !request->method || !request->on_recvd_response || !request->on_error) {
		request->error_code = nhr_error_code_missed_parameter;
		return nhr_false;
	}

	request->error_code = nhr_error_code_none;
	return nhr_request_create_start_work_thread(request);
}